

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_che.c
# Opt level: O0

void beltCHEStart(void *state,octet *key,size_t len,octet *iv)

{
  undefined8 *in_RCX;
  u32 *in_RDI;
  belt_che_st *st;
  undefined7 in_stack_ffffffffffffffc8;
  octet in_stack_ffffffffffffffcf;
  u32 *in_stack_ffffffffffffffd0;
  u64 *dest;
  
  beltKeyExpand2(in_stack_ffffffffffffffd0,
                 (octet *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),0x147636);
  *(undefined8 *)(in_RDI + 0xc) = *in_RCX;
  *(undefined8 *)(in_RDI + 0xe) = in_RCX[1];
  beltBlockEncr((octet *)(in_RDI + 0xc),in_RDI);
  u32From(in_stack_ffffffffffffffd0,
          (void *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),0x147688);
  dest = (u64 *)(in_RDI + 0x10);
  beltH();
  u64From(dest,(void *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),0x1476af);
  memSet(dest,in_stack_ffffffffffffffcf,0x1476c4);
  in_RDI[0x26] = 0;
  in_RDI[0x27] = 0;
  in_RDI[0x24] = 0;
  in_RDI[0x25] = 0;
  return;
}

Assistant:

void beltCHEStart(void* state, const octet key[], size_t len, 
	const octet iv[16])
{
	belt_che_st* st = (belt_che_st*)state;
	ASSERT(memIsDisjoint2(iv, 16, state, beltCHE_keep()));
	// разобрать key и iv
	beltKeyExpand2(st->key, key, len);
	beltBlockCopy(st->r, iv);
	beltBlockEncr((octet*)st->r, st->key);
	u32From(st->s, st->r, 16);
#if (OCTET_ORDER == BIG_ENDIAN)
	beltBlockRevW(st->r);
#endif
	// подготовить t
	wwFrom(st->t, beltH(), 16);
	// обнулить счетчики
	memSetZero(st->len, sizeof(st->len));
	st->reserved = 0;
	st->filled = 0;
}